

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O2

time_t time2sub(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
               int_fast32_t offset,_Bool *okayp,_Bool do_norm_secs)

{
  _Bool _Var1;
  uint m;
  int iVar2;
  long lVar3;
  tm *ptVar4;
  int iVar5;
  ulong uVar6;
  ttinfo *ptVar7;
  long lVar8;
  ulong uVar9;
  undefined3 in_register_00000089;
  uchar *puVar10;
  long lVar11;
  ttinfo *ptVar12;
  bool bVar13;
  bool bVar14;
  int_fast32_t y;
  time_t t;
  int_fast32_t local_bc;
  tm yourtm;
  time_t newt;
  int local_6c;
  ttinfo *local_68;
  uchar *local_60;
  tm mytm;
  
  *okayp = false;
  yourtm.tm_isdst = tmp->tm_isdst;
  yourtm.tm_sec = tmp->tm_sec;
  yourtm.tm_min = tmp->tm_min;
  yourtm.tm_hour = tmp->tm_hour;
  yourtm.tm_mday = tmp->tm_mday;
  yourtm.tm_mon = tmp->tm_mon;
  yourtm.tm_year = tmp->tm_year;
  yourtm.tm_wday = tmp->tm_wday;
  yourtm.tm_yday = tmp->tm_yday;
  if ((CONCAT31(in_register_00000089,do_norm_secs) != 0) &&
     (_Var1 = normalize_overflow(&yourtm.tm_min,&yourtm.tm_sec,0x3c), _Var1)) {
    return -1;
  }
  _Var1 = normalize_overflow(&yourtm.tm_hour,&yourtm.tm_min,0x3c);
  if (_Var1) {
    return -1;
  }
  _Var1 = normalize_overflow(&yourtm.tm_mday,&yourtm.tm_hour,0x18);
  if (_Var1) {
    return -1;
  }
  y = yourtm.tm_year;
  if (yourtm.tm_mon < 0) {
    m = ~((uint)~yourtm.tm_mon / 0xc);
  }
  else {
    m = (uint)((yourtm._16_8_ & 0xffffffff) / 0xc);
  }
  yourtm.tm_mon = m * -0xc + yourtm.tm_mon;
  _Var1 = increment_overflow32(&y,m);
  if (_Var1) {
    return -1;
  }
  _Var1 = increment_overflow32(&y,0x76c);
  if (_Var1) {
    return -1;
  }
  iVar2 = yourtm.tm_mday;
  local_bc = offset;
  while (iVar2 < 1) {
    _Var1 = increment_overflow32(&y,-1);
    if (_Var1) {
      return -1;
    }
    iVar2 = _PDCLIB_is_leap((uint)(1 < yourtm.tm_mon) + y);
    iVar2 = yourtm.tm_mday + year_lengths[iVar2];
    yourtm.tm_mday = iVar2;
  }
  while (0x16e < iVar2) {
    iVar2 = _PDCLIB_is_leap((uint)(1 < yourtm.tm_mon) + y);
    iVar2 = yourtm.tm_mday - year_lengths[iVar2];
    yourtm.tm_mday = iVar2;
    _Var1 = increment_overflow32(&y,1);
    if (_Var1) {
      return -1;
    }
  }
  while( true ) {
    iVar2 = _PDCLIB_is_leap(y);
    iVar5 = yourtm.tm_mday - mon_lengths[iVar2][yourtm.tm_mon];
    if (iVar5 == 0 || yourtm.tm_mday < mon_lengths[iVar2][yourtm.tm_mon]) break;
    yourtm.tm_mday = iVar5;
    bVar14 = 10 < yourtm.tm_mon;
    yourtm.tm_mon = yourtm.tm_mon + 1;
    if (bVar14) {
      yourtm.tm_mon = 0;
      _Var1 = increment_overflow32(&y,1);
      if (_Var1) {
        return -1;
      }
    }
  }
  _Var1 = increment_overflow32(&y,-0x76c);
  if (_Var1) {
    return -1;
  }
  yourtm.tm_year = y;
  iVar2 = yourtm.tm_sec;
  local_6c = 0;
  if (0x3b < (uint)yourtm.tm_sec) {
    if (y < 0x46) {
      _Var1 = _PDCLIB_increment_overflow(&yourtm.tm_sec,-0x3b);
      if (_Var1) {
        return -1;
      }
      local_6c = yourtm.tm_sec;
      yourtm.tm_sec = 0x3b;
    }
    else {
      yourtm._0_8_ = yourtm._0_8_ & 0xffffffff00000000;
      local_6c = iVar2;
    }
  }
  lVar8 = 0x7fffffffffffffff;
  lVar11 = -0x8000000000000000;
  do {
    lVar3 = lVar8 / 2 + lVar11 / 2;
    t = lVar11;
    if ((lVar11 <= lVar3) && (t = lVar3, lVar8 < lVar3)) {
      t = lVar8;
    }
    ptVar4 = (*funcp)(sp,&t,local_bc,&mytm);
    if (ptVar4 == (tm *)0x0) {
      bVar14 = t < 0;
      bVar13 = t == 0;
    }
    else {
      iVar2 = tmcomp(&mytm,&yourtm);
      bVar14 = iVar2 < 0;
      bVar13 = iVar2 == 0;
      if (bVar13) {
        if ((yourtm.tm_isdst < 0) || (mytm.tm_isdst == yourtm.tm_isdst)) {
LAB_00103b31:
          t = local_6c + t;
          newt = t;
          ptVar4 = (*funcp)(sp,&t,local_bc,tmp);
          if (ptVar4 != (tm *)0x0) {
            *okayp = true;
            return t;
          }
          return t;
        }
        if (sp == (state *)0x0) {
          return -1;
        }
        uVar6 = (ulong)(uint)sp->typecnt;
        local_68 = sp->ttis;
        local_60 = sp->types + 0x7c4;
        ptVar7 = local_68;
        do {
          do {
            if ((int)uVar6 < 1) {
              return -1;
            }
            uVar6 = uVar6 - 1;
          } while (yourtm.tm_isdst != (uint)ptVar7[uVar6].isdst);
          ptVar12 = ptVar7 + uVar6;
          uVar9 = (ulong)(uint)sp->typecnt;
          puVar10 = local_60 + uVar9 * 0x10;
          for (; ptVar7 = local_68, 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
            if (yourtm.tm_isdst != (uint)*puVar10) {
              newt = (*(int *)(puVar10 + -4) + t) - (long)ptVar12->utoff;
              ptVar4 = (*funcp)(sp,&newt,local_bc,&mytm);
              if (((ptVar4 != (tm *)0x0) && (iVar2 = tmcomp(&mytm,&yourtm), iVar2 == 0)) &&
                 (mytm.tm_isdst == yourtm.tm_isdst)) {
                t = newt;
                goto LAB_00103b31;
              }
            }
            puVar10 = puVar10 + -0x10;
          }
        } while( true );
      }
    }
    if (t == lVar11) {
      if (lVar11 == 0x7fffffffffffffff) {
        return -1;
      }
      t = lVar11 + 1;
      lVar3 = t;
    }
    else {
      lVar3 = lVar11;
      if (t == lVar8) {
        if (lVar8 == -0x8000000000000000) {
          return -1;
        }
        t = lVar8 + -1;
        lVar8 = t;
      }
    }
    if (lVar8 < lVar3) {
      return -1;
    }
    lVar11 = t;
    if (!bVar13 && !bVar14) {
      lVar8 = t;
      lVar11 = lVar3;
    }
  } while( true );
}

Assistant:

static time_t time2sub( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset, bool * okayp, bool do_norm_secs )
{
    int          dir;
    int          i, j;
    int          saved_seconds;
    int_fast32_t li;
    time_t       lo;
    time_t       hi;
    int_fast32_t y;
    time_t       newt;
    time_t       t;
    struct tm    yourtm, mytm;

    *okayp = false;
    yourtm = *tmp;

    if ( do_norm_secs )
    {
        if ( normalize_overflow( &yourtm.tm_min, &yourtm.tm_sec, SECSPERMIN ) )
        {
            return WRONG;
        }
    }

    if ( normalize_overflow( &yourtm.tm_hour, &yourtm.tm_min, MINSPERHOUR ) )
    {
        return WRONG;
    }

    if ( normalize_overflow( &yourtm.tm_mday, &yourtm.tm_hour, HOURSPERDAY ) )
    {
        return WRONG;
    }

    y = yourtm.tm_year;

    if ( normalize_overflow32( &y, &yourtm.tm_mon, MONSPERYEAR ) )
    {
        return WRONG;
    }

    /* Turn y into an actual year number for now.
       It is converted back to an offset from TM_YEAR_BASE later.
    */
    if ( increment_overflow32( &y, TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    while ( yourtm.tm_mday <= 0 )
    {
        if ( increment_overflow32( &y, -1 ) )
        {
            return WRONG;
        }

        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday += year_lengths[ _PDCLIB_is_leap( li ) ];
    }
    while ( yourtm.tm_mday > DAYSPERLYEAR )
    {
        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday -= year_lengths[ _PDCLIB_is_leap( li ) ];

        if ( increment_overflow32( &y, 1 ) )
        {
            return WRONG;
        }
    }

    for ( ; ; )
    {
        i = mon_lengths[ _PDCLIB_is_leap( y ) ][ yourtm.tm_mon ];

        if ( yourtm.tm_mday <= i )
        {
            break;
        }

        yourtm.tm_mday -= i;

        if ( ++yourtm.tm_mon >= MONSPERYEAR )
        {
            yourtm.tm_mon = 0;

            if ( increment_overflow32( &y, 1 ) )
            {
                return WRONG;
            }
        }
    }

    if ( increment_overflow32( &y, -TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    if ( ! ( _PDCLIB_INT_MIN <= y && y <= _PDCLIB_INT_MAX ) )
    {
        return WRONG;
    }

    yourtm.tm_year = y;

    if ( yourtm.tm_sec >= 0 && yourtm.tm_sec < SECSPERMIN )
    {
        saved_seconds = 0;
    }
    else if ( y + TM_YEAR_BASE < EPOCH_YEAR )
    {
        /* We can't set tm_sec to 0, because that might push the
           time below the minimum representable time.
           Set tm_sec to 59 instead.
           This assumes that the minimum representable time is
           not in the same minute that a leap second was deleted from,
           which is a safer assumption than using 58 would be.
        */
        if ( _PDCLIB_increment_overflow( &yourtm.tm_sec, 1 - SECSPERMIN ) )
        {
            return WRONG;
        }

        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = SECSPERMIN - 1;
    }
    else
    {
        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = 0;
    }

    /* Do a binary search (this works whatever time_t's type is). */
    lo = _PDCLIB_TIME_MIN;
    hi = _PDCLIB_TIME_MAX;

    for ( ; ; )
    {
        t = lo / 2 + hi / 2;

        if ( t < lo )
        {
            t = lo;
        }
        else if ( t > hi )
        {
            t = hi;
        }

        if ( ! funcp( sp, &t, offset, &mytm ) )
        {
            /* Assume that t is too extreme to be represented in
               a struct tm; arrange things so that it is less
               extreme on the next pass.
            */
            dir = ( t > 0 ) ? 1 : -1;
        }
        else
        {
            dir = tmcomp( &mytm, &yourtm );
        }

        if ( dir != 0 )
        {
            if ( t == lo )
            {
                if ( t == _PDCLIB_TIME_MAX )
                {
                    return WRONG;
                }

                ++t;
                ++lo;
            }
            else if ( t == hi )
            {
                if ( t == _PDCLIB_TIME_MIN )
                {
                    return WRONG;
                }

                --t;
                --hi;
            }

            if ( lo > hi )
            {
                return WRONG;
            }

            if ( dir > 0 )
            {
                hi = t;
            }
            else
            {
                lo = t;
            }

            continue;
        }

#if defined TM_GMTOFF && ! UNINIT_TRAP
        if ( mytm.TM_GMTOFF != yourtm.TM_GMTOFF
            && ( yourtm.TM_GMTOFF < 0
            ? ( -SECSPERDAY <= yourtm.TM_GMTOFF
               && ( mytm.TM_GMTOFF <=
                   ( SMALLEST ( _PDCLIB_INT_FAST32_MAX, _PDCLIB_LONG_MAX )
                + yourtm.TM_GMTOFF ) ) )
            : ( yourtm.TM_GMTOFF <= SECSPERDAY
               && ( ( BIGGEST ( _PDCLIB_INT_FAST32_MIN, _PDCLIB_LONG_MIN )
                + yourtm.TM_GMTOFF )
                   <= mytm.TM_GMTOFF ) ) ) )
        {
            /* MYTM matches YOURTM except with the wrong UT offset.
               YOURTM.TM_GMTOFF is plausible, so try it instead.
               It's OK if YOURTM.TM_GMTOFF contains uninitialized data,
               since the guess gets checked.
            */
            time_t altt = t;
            int_fast32_t diff = mytm.TM_GMTOFF - yourtm.TM_GMTOFF;

            if ( ! increment_overflow_time( &altt, diff ) )
            {
                struct tm alttm;
                if ( funcp( sp, &altt, offset, &alttm )
                    && alttm.tm_isdst == mytm.tm_isdst
                    && alttm.TM_GMTOFF == yourtm.TM_GMTOFF
                    && tmcomp( &alttm, &yourtm ) == 0 )
                {
                    t = altt;
                    mytm = alttm;
                }
            }
        }
#endif

        if ( yourtm.tm_isdst < 0 || mytm.tm_isdst == yourtm.tm_isdst )
        {
            break;
        }

        /* Right time, wrong type.
           Hunt for right time, right type.
           It's okay to guess wrong since the guess
           gets checked.
        */
        if ( sp == NULL )
        {
            return WRONG;
        }

        for ( i = sp->typecnt - 1; i >= 0; --i )
        {
            if ( sp->ttis[ i ].isdst != yourtm.tm_isdst )
            {
                continue;
            }

            for ( j = sp->typecnt - 1; j >= 0; --j )
            {
                if ( sp->ttis[ j ].isdst == yourtm.tm_isdst )
                {
                    continue;
                }

                newt = ( t + sp->ttis[ j ].utoff - sp->ttis[ i ].utoff );

                if ( ! funcp( sp, &newt, offset, &mytm ) )
                {
                    continue;
                }

                if ( tmcomp( &mytm, &yourtm ) != 0 )
                {
                    continue;
                }

                if ( mytm.tm_isdst != yourtm.tm_isdst )
                {
                    continue;
                }

                /* We have a match. */
                t = newt;
                goto label;
            }
        }

        return WRONG;
    }

label:
    newt = t + saved_seconds;

    if ( ( newt < t ) != ( saved_seconds < 0 ) )
    {
        return WRONG;
    }

    t = newt;

    if ( funcp( sp, &t, offset, tmp ) )
    {
        *okayp = true;
    }

    return t;
}